

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_object_set_value(JSON_Object *object,char *name,JSON_Value *value)

{
  long lVar1;
  JSON_Status JVar2;
  size_t sVar3;
  JSON_Value *pJVar4;
  char *pcVar5;
  JSON_Status res;
  char *key_copy;
  JSON_Value *old_value;
  size_t item_ix;
  size_t cell_ix;
  unsigned_long uStack_30;
  parson_bool_t found;
  unsigned_long hash;
  JSON_Value *value_local;
  char *name_local;
  JSON_Object *object_local;
  
  uStack_30 = 0;
  cell_ix._4_4_ = 0;
  if ((((object == (JSON_Object *)0x0) || (name == (char *)0x0)) || (value == (JSON_Value *)0x0)) ||
     (value->parent != (JSON_Value *)0x0)) {
    object_local._4_4_ = -1;
  }
  else {
    hash = (unsigned_long)value;
    value_local = (JSON_Value *)name;
    name_local = (char *)object;
    sVar3 = strlen(name);
    uStack_30 = hash_string(name,sVar3);
    pcVar5 = name_local;
    pJVar4 = value_local;
    cell_ix._4_4_ = 0;
    sVar3 = strlen((char *)value_local);
    item_ix = json_object_get_cell_ix
                        ((JSON_Object *)pcVar5,(char *)pJVar4,sVar3,uStack_30,
                         (parson_bool_t *)((long)&cell_ix + 4));
    if (cell_ix._4_4_ == 0) {
      if (*(ulong *)(name_local + 0x38) <= *(ulong *)(name_local + 0x30)) {
        JVar2 = json_object_grow_and_rehash((JSON_Object *)name_local);
        pcVar5 = name_local;
        pJVar4 = value_local;
        if (JVar2 != 0) {
          return -1;
        }
        sVar3 = strlen((char *)value_local);
        item_ix = json_object_get_cell_ix
                            ((JSON_Object *)pcVar5,(char *)pJVar4,sVar3,uStack_30,
                             (parson_bool_t *)((long)&cell_ix + 4));
      }
      pcVar5 = parson_strdup((char *)value_local);
      if (pcVar5 == (char *)0x0) {
        object_local._4_4_ = -1;
      }
      else {
        *(char **)(*(long *)(name_local + 0x18) + *(long *)(name_local + 0x30) * 8) = pcVar5;
        *(undefined8 *)(*(long *)(name_local + 8) + item_ix * 8) =
             *(undefined8 *)(name_local + 0x30);
        *(unsigned_long *)(*(long *)(name_local + 0x20) + *(long *)(name_local + 0x30) * 8) = hash;
        *(size_t *)(*(long *)(name_local + 0x28) + *(long *)(name_local + 0x30) * 8) = item_ix;
        *(unsigned_long *)(*(long *)(name_local + 0x10) + *(long *)(name_local + 0x30) * 8) =
             uStack_30;
        *(long *)(name_local + 0x30) = *(long *)(name_local + 0x30) + 1;
        pJVar4 = json_object_get_wrapping_value((JSON_Object *)name_local);
        *(JSON_Value **)hash = pJVar4;
        object_local._4_4_ = 0;
      }
    }
    else {
      lVar1 = *(long *)(*(long *)(name_local + 8) + item_ix * 8);
      json_value_free(*(JSON_Value **)(*(long *)(name_local + 0x20) + lVar1 * 8));
      *(unsigned_long *)(*(long *)(name_local + 0x20) + lVar1 * 8) = hash;
      pJVar4 = json_object_get_wrapping_value((JSON_Object *)name_local);
      *(JSON_Value **)hash = pJVar4;
      object_local._4_4_ = 0;
    }
  }
  return object_local._4_4_;
}

Assistant:

JSON_Status json_object_set_value(JSON_Object *object, const char *name, JSON_Value *value) {
    unsigned long hash = 0;
    parson_bool_t found = PARSON_FALSE;
    size_t cell_ix = 0;
    size_t item_ix = 0;
    JSON_Value *old_value = NULL;
    char *key_copy = NULL;

    if (!object || !name || !value || value->parent) {
        return JSONFailure;
    }
    hash = hash_string(name, strlen(name));
    found = PARSON_FALSE;
    cell_ix = json_object_get_cell_ix(object, name, strlen(name), hash, &found);
    if (found) {
        item_ix = object->cells[cell_ix];
        old_value = object->values[item_ix];
        json_value_free(old_value);
        object->values[item_ix] = value;
        value->parent = json_object_get_wrapping_value(object);
        return JSONSuccess;
    }
    if (object->count >= object->item_capacity) {
        JSON_Status res = json_object_grow_and_rehash(object);
        if (res != JSONSuccess) {
            return JSONFailure;
        }
        cell_ix = json_object_get_cell_ix(object, name, strlen(name), hash, &found);
    }
    key_copy = parson_strdup(name);
    if (!key_copy) {
        return JSONFailure;
    }
    object->names[object->count] = key_copy;
    object->cells[cell_ix] = object->count;
    object->values[object->count] = value;
    object->cell_ixs[object->count] = cell_ix;
    object->hashes[object->count] = hash;
    object->count++;
    value->parent = json_object_get_wrapping_value(object);
    return JSONSuccess;
}